

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

bool __thiscall
FlowGraph::RemoveUnreachableBlock(FlowGraph *this,BasicBlock *block,GlobOpt *globOpt)

{
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar1;
  BasicBlock *pBVar2;
  code *pcVar3;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  bool bVar5;
  undefined4 *puVar6;
  Type *ppFVar7;
  Loop *currentLoop;
  Loop *pLVar8;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar9;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar10;
  undefined1 local_40 [8];
  Iterator __iter;
  
  pSVar1 = &block->predList;
  pSVar4 = __iter.list;
  if ((((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
        (block->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
        super_SListNodeBase<Memory::ArenaAllocator>.next != pSVar1) ||
      (pSVar10 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)&DAT_00000001,
      this->func->m_fg->blockList == block)) &&
     (pSVar9 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0, pSVar10 = pSVar9,
     (block->field_0x18 & 4) != 0)) {
    local_40 = (undefined1  [8])pSVar1;
    __iter.list = &pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pSVar10 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)&DAT_00000001;
    while( true ) {
      if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_0041ef8f;
        *puVar6 = 0;
      }
      __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                    ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      pSVar4 = pSVar9;
      if ((undefined1  [8])__iter.list == local_40) break;
      ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_40);
      pBVar2 = (*ppFVar7)->predBlock;
      if (pBVar2 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x98c,"(pred)","pred");
        if (!bVar5) {
LAB_0041ef8f:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
      pLVar8 = pBVar2->loop;
      bVar5 = pLVar8 != (Loop *)0x0;
      if (pLVar8 != block->loop && bVar5) {
        do {
          pLVar8 = pLVar8->parent;
          bVar5 = pLVar8 != (Loop *)0x0;
          if (pLVar8 == block->loop) break;
        } while (pLVar8 != (Loop *)0x0);
      }
      if (!bVar5) {
        pSVar10 = pSVar9;
      }
    }
  }
  __iter.list = pSVar4;
  if (pSVar10 != (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    RemoveBlock(this,block,globOpt,false);
  }
  return (bool)(char)pSVar10;
}

Assistant:

bool
FlowGraph::RemoveUnreachableBlock(BasicBlock *block, GlobOpt * globOpt)
{
    bool isDead = false;

    if ((block->GetPredList() == nullptr || block->GetPredList()->Empty()) && block != this->func->m_fg->blockList)
    {
        isDead = true;
    }
    else if (block->isLoopHeader)
    {
        // A dead loop still has back-edges pointing to it...
        isDead = true;
        FOREACH_PREDECESSOR_BLOCK(pred, block)
        {
            if (!block->loop->IsDescendentOrSelf(pred->loop))
            {
                isDead = false;
            }
        } NEXT_PREDECESSOR_BLOCK;
    }

    if (isDead)
    {
        this->RemoveBlock(block, globOpt);
        return true;
    }
    return false;
}